

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::ValidPadding::ByteSizeLong(ValidPadding *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  if (this->paddingamounts_ == (BorderAmounts *)0x0 ||
      this == (ValidPadding *)&_ValidPadding_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = BorderAmounts::ByteSizeLong(this->paddingamounts_);
    uVar3 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t ValidPadding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ValidPadding)
  size_t total_size = 0;

  // .CoreML.Specification.BorderAmounts paddingAmounts = 1;
  if (this->has_paddingamounts()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->paddingamounts_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}